

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O3

void __thiscall
myEmployeeCustomConstructor::myEmployeeCustomConstructor
          (myEmployeeCustomConstructor *this,int m_kids,double m_latitude)

{
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"John","");
  (this->super_myEmployee)._vptr_myEmployee = (_func_int **)&PTR__myEmployee_001583a8;
  (this->super_myEmployee).age = 0x50;
  (this->super_myEmployee).wages = 4000.0;
  (this->super_myEmployee).body = ATHLETIC;
  (this->super_myEmployee).name._M_dataplus._M_p = (pointer)&(this->super_myEmployee).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_myEmployee).name,local_40,local_38 + (long)local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  (this->super_myEmployee)._vptr_myEmployee = (_func_int **)&PTR__myEmployee_00158790;
  this->latitude = m_latitude;
  this->kids = m_kids;
  this->legs = 2;
  return;
}

Assistant:

myEmployeeCustomConstructor(int m_kids, double m_latitude)
        : myEmployee(80, 4000), 
        latitude(m_latitude),
        kids(m_kids),
        legs (2) {}